

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O2

void __thiscall
cmCMakePresetsGraph::BuildPreset::BuildPreset(BuildPreset *this,BuildPreset *param_1)

{
  pointer pbVar1;
  undefined3 uVar2;
  undefined2 uVar3;
  _Storage<int,_true> _Var4;
  optional<bool> oVar5;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__BuildPreset_00a0c498;
  std::__cxx11::string::string((string *)&this->ConfigurePreset,(string *)&param_1->ConfigurePreset)
  ;
  uVar2 = *(undefined3 *)
           &(param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>.field_0x5;
  (this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = (param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged;
  *(undefined3 *)
   &(this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    field_0x5 = uVar2;
  uVar3 = *(undefined2 *)&param_1->field_0xfa;
  _Var4 = (param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload;
  this->InheritConfigureEnvironment =
       (_Optional_base<bool,_true,_true>)
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>;
  *(undefined2 *)&this->field_0xfa = uVar3;
  (this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload = _Var4;
  pbVar1 = (param_1->Targets).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Targets).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Targets).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->Configuration,(string *)&param_1->Configuration);
  oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->Verbose).super__Optional_base<bool,_true,_true>;
  this->CleanFirst =
       (_Optional_base<bool,_true,_true>)
       (param_1->CleanFirst).super__Optional_base<bool,_true,_true>;
  this->Verbose =
       (optional<bool>)
       oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  pbVar1 = (param_1->NativeToolOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->NativeToolOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->NativeToolOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>._M_payload.
  super__Optional_payload_base<PackageResolveMode> =
       (param_1->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>.
       _M_payload.super__Optional_payload_base<PackageResolveMode>;
  return;
}

Assistant:

BuildPreset(BuildPreset&& /*other*/) = default;